

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 MemObjStringValue(SyBlob *pOut,jx9_value *pObj)

{
  jx9_hashmap *pMap;
  sxu32 sVar1;
  uint uVar2;
  sxi32 sVar3;
  jx9_real jVar4;
  char *pcVar5;
  json_private_data local_20;
  
  uVar2 = pObj->iFlags;
  if ((uVar2 & 4) != 0) {
    sVar1 = SyBlobFormat(pOut,"%.15g",(pObj->x).rVal);
    return sVar1;
  }
  if ((uVar2 & 2) == 0) {
    if ((uVar2 & 8) != 0) {
      if ((pObj->x).iVal == 0) {
        pcVar5 = "false";
        sVar1 = 5;
      }
      else {
        pcVar5 = "true";
        sVar1 = 4;
      }
      sVar3 = SyBlobAppend(pOut,pcVar5,sVar1);
      return sVar3;
    }
    if ((uVar2 & 0x40) == 0) {
      if ((uVar2 >> 8 & 1) != 0) {
        jVar4 = (pObj->x).rVal;
        pcVar5 = "ResourceID_%#x";
        goto LAB_0011b71a;
      }
    }
    else {
      local_20.nRecCount = 0;
      local_20.isFirst = 1;
      local_20.iFlags = 0;
      local_20.pOut = pOut;
      VmJsonEncode(pObj,&local_20);
      pMap = (jx9_hashmap *)(pObj->x).pOther;
      uVar2 = pMap->iRef;
      pMap->iRef = uVar2 - 1;
      if ((int)uVar2 < 2) {
        uVar2 = jx9HashmapRelease(pMap,1);
      }
    }
    return uVar2;
  }
  jVar4 = (pObj->x).rVal;
  pcVar5 = "%qd";
LAB_0011b71a:
  sVar1 = SyBlobFormat(pOut,pcVar5,jVar4);
  return sVar1;
}

Assistant:

static sxi32 MemObjStringValue(SyBlob *pOut,jx9_value *pObj)
{
	if( pObj->iFlags & MEMOBJ_REAL ){
		SyBlobFormat(&(*pOut), "%.15g", pObj->x.rVal);
	}else if( pObj->iFlags & MEMOBJ_INT ){
		SyBlobFormat(&(*pOut), "%qd", pObj->x.iVal);
		/* %qd (BSD quad) is equivalent to %lld in the libc printf */
	}else if( pObj->iFlags & MEMOBJ_BOOL ){
		if( pObj->x.iVal ){
			SyBlobAppend(&(*pOut),"true", sizeof("true")-1);
		}else{
			SyBlobAppend(&(*pOut),"false", sizeof("false")-1);
		}
	}else if( pObj->iFlags & MEMOBJ_HASHMAP ){
		/* Serialize JSON object or array */
		jx9JsonSerialize(pObj,pOut);
		jx9HashmapUnref((jx9_hashmap *)pObj->x.pOther);
	}else if(pObj->iFlags & MEMOBJ_RES ){
		SyBlobFormat(&(*pOut), "ResourceID_%#x", pObj->x.pOther);
	}
	return SXRET_OK;
}